

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void av1_compute_stats_sse4_1
               (int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,int use_downsampled_wiener_stats)

{
  int in_EDI;
  int in_stack_000025fc;
  int16_t *in_stack_00002600;
  int16_t *in_stack_00002608;
  uint8_t *in_stack_00002610;
  uint8_t *in_stack_00002618;
  int in_stack_00002624;
  int in_stack_00002640;
  int in_stack_00002648;
  int in_stack_00002650;
  int in_stack_00002658;
  int in_stack_00002660;
  int64_t *in_stack_00002668;
  int64_t *in_stack_00002670;
  int in_stack_00002678;
  int in_stack_00004100;
  int in_stack_00004104;
  int in_stack_00004108;
  int in_stack_0000410c;
  uint8_t *in_stack_00004110;
  uint8_t *in_stack_00004118;
  int in_stack_00004130;
  int in_stack_00004138;
  int64_t *in_stack_00004140;
  int64_t *in_stack_00004148;
  int in_stack_00004150;
  int in_stack_0000b040;
  int in_stack_0000b044;
  int in_stack_0000b048;
  int in_stack_0000b04c;
  uint8_t *in_stack_0000b050;
  uint8_t *in_stack_0000b058;
  int in_stack_0000b070;
  int in_stack_0000b078;
  int64_t *in_stack_0000b080;
  int64_t *in_stack_0000b088;
  int in_stack_0000b090;
  
  if (in_EDI == 7) {
    compute_stats_win7_opt_sse4_1
              (in_stack_0000b058,in_stack_0000b050,in_stack_0000b04c,in_stack_0000b048,
               in_stack_0000b044,in_stack_0000b040,in_stack_0000b070,in_stack_0000b078,
               in_stack_0000b080,in_stack_0000b088,in_stack_0000b090);
  }
  else if (in_EDI == 5) {
    compute_stats_win5_opt_sse4_1
              (in_stack_00004118,in_stack_00004110,in_stack_0000410c,in_stack_00004108,
               in_stack_00004104,in_stack_00004100,in_stack_00004130,in_stack_00004138,
               in_stack_00004140,in_stack_00004148,in_stack_00004150);
  }
  else {
    av1_compute_stats_c(in_stack_00002624,in_stack_00002618,in_stack_00002610,in_stack_00002608,
                        in_stack_00002600,in_stack_000025fc,in_stack_00002640,in_stack_00002648,
                        in_stack_00002650,in_stack_00002658,in_stack_00002660,in_stack_00002668,
                        in_stack_00002670,in_stack_00002678);
  }
  return;
}

Assistant:

void av1_compute_stats_sse4_1(int wiener_win, const uint8_t *dgd,
                              const uint8_t *src, int16_t *dgd_avg,
                              int16_t *src_avg, int h_start, int h_end,
                              int v_start, int v_end, int dgd_stride,
                              int src_stride, int64_t *M, int64_t *H,
                              int use_downsampled_wiener_stats) {
  if (wiener_win == WIENER_WIN) {
    compute_stats_win7_opt_sse4_1(dgd, src, h_start, h_end, v_start, v_end,
                                  dgd_stride, src_stride, M, H,
                                  use_downsampled_wiener_stats);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    compute_stats_win5_opt_sse4_1(dgd, src, h_start, h_end, v_start, v_end,
                                  dgd_stride, src_stride, M, H,
                                  use_downsampled_wiener_stats);
  } else {
    av1_compute_stats_c(wiener_win, dgd, src, dgd_avg, src_avg, h_start, h_end,
                        v_start, v_end, dgd_stride, src_stride, M, H,
                        use_downsampled_wiener_stats);
  }
}